

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

btScalar __thiscall btSoftBody::getVolume(btSoftBody *this)

{
  int iVar1;
  Node *pNVar2;
  btVector3 *in_RDI;
  btScalar bVar3;
  Face *f;
  btVector3 org;
  int ni;
  int i;
  btScalar vol;
  btVector3 *in_stack_ffffffffffffff78;
  btVector3 *v1;
  btVector3 *v1_00;
  btVector3 in_stack_ffffffffffffff90;
  btVector3 local_24;
  int local_14;
  int local_10;
  float local_c;
  
  local_c = 0.0;
  iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                    ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37));
  if (0 < iVar1) {
    pNVar2 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37),0);
    local_24.m_floats._0_8_ = *(undefined8 *)(pNVar2->m_x).m_floats;
    local_24.m_floats._8_8_ = *(undefined8 *)((pNVar2->m_x).m_floats + 2);
    local_10 = 0;
    local_14 = btAlignedObjectArray<btSoftBody::Face>::size
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b));
    for (; v1_00 = in_stack_ffffffffffffff90.m_floats._0_8_, local_10 < local_14;
        local_10 = local_10 + 1) {
      btAlignedObjectArray<btSoftBody::Face>::operator[]
                ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b),local_10);
      v1 = &local_24;
      operator-(v1_00,in_RDI);
      operator-(v1_00,in_RDI);
      in_stack_ffffffffffffff90 = operator-(v1_00,in_RDI);
      btCross(v1,in_stack_ffffffffffffff78);
      bVar3 = btDot(v1,in_stack_ffffffffffffff78);
      local_c = bVar3 + local_c;
    }
    local_c = local_c / 6.0;
  }
  return local_c;
}

Assistant:

btScalar		btSoftBody::getVolume() const
{
	btScalar	vol=0;
	if(m_nodes.size()>0)
	{
		int i,ni;

		const btVector3	org=m_nodes[0].m_x;
		for(i=0,ni=m_faces.size();i<ni;++i)
		{
			const Face&	f=m_faces[i];
			vol+=btDot(f.m_n[0]->m_x-org,btCross(f.m_n[1]->m_x-org,f.m_n[2]->m_x-org));
		}
		vol/=(btScalar)6;
	}
	return(vol);
}